

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9MemObjToBool(jx9_value *pObj)

{
  char cVar1;
  uint uVar2;
  sxu32 SLen;
  sxi32 sVar3;
  anon_union_8_3_18420de5_for_x aVar4;
  char *zIn;
  char *zLeft;
  char *pcVar5;
  
  uVar2 = pObj->iFlags;
  if ((uVar2 & 8) != 0) {
    return 0;
  }
  if ((uVar2 & 4) != 0) {
    aVar4._0_4_ = -(uint)((pObj->x).rVal != 0.0) & 1;
    aVar4.iVal._4_4_ = 0;
    goto LAB_0011cc8d;
  }
  if ((uVar2 & 2) != 0) {
LAB_0011cc04:
    aVar4.iVal._1_7_ = 0;
    aVar4.iVal._0_1_ = (pObj->x).iVal != 0;
    goto LAB_0011cc8d;
  }
  if ((uVar2 & 1) == 0) {
    if ((uVar2 & 0x20) == 0) {
      if ((uVar2 & 0x40) != 0) {
        aVar4.iVal._1_7_ = 0;
        aVar4.iVal._0_1_ = ((jx9_hashmap *)(pObj->x).pOther)->nEntry != 0;
        jx9HashmapUnref((jx9_hashmap *)(pObj->x).pOther);
        goto LAB_0011cc8d;
      }
      if ((uVar2 >> 8 & 1) != 0) goto LAB_0011cc04;
    }
LAB_0011cc8a:
    aVar4.rVal = 0.0;
    goto LAB_0011cc8d;
  }
  uVar2 = (pObj->sBlob).nByte;
  if ((ulong)uVar2 == 0) goto LAB_0011cc8a;
  zLeft = (char *)(pObj->sBlob).pBlob;
  switch(uVar2) {
  case 2:
    pcVar5 = "on";
    SLen = 2;
    break;
  case 3:
    pcVar5 = "yes";
    SLen = 3;
    break;
  case 4:
    pcVar5 = "true";
    SLen = 4;
    break;
  case 5:
    sVar3 = SyStrnicmp(zLeft,"false",5);
    if (sVar3 == 0) goto LAB_0011cc8a;
  default:
    goto switchD_0011cc4a_default;
  }
  sVar3 = SyStrnicmp(zLeft,pcVar5,SLen);
  if (sVar3 == 0) {
    aVar4.rVal = 4.94065645841247e-324;
  }
  else {
switchD_0011cc4a_default:
    pcVar5 = zLeft + uVar2;
    do {
      aVar4.iVal._1_7_ = 0;
      aVar4.iVal._0_1_ = zLeft < pcVar5;
      if (zLeft >= pcVar5) break;
      cVar1 = *zLeft;
      zLeft = zLeft + 1;
    } while (cVar1 == '0');
  }
LAB_0011cc8d:
  pObj->x = aVar4;
  SyBlobRelease(&pObj->sBlob);
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 jx9MemObjToBool(jx9_value *pObj)
{
	if( (pObj->iFlags & MEMOBJ_BOOL) == 0 ){
		/* Preform the conversion */
		pObj->x.iVal = MemObjBooleanValue(&(*pObj));
		/* Invalidate any prior representations */
		SyBlobRelease(&pObj->sBlob);
		MemObjSetType(pObj, MEMOBJ_BOOL);
	}
	return SXRET_OK;
}